

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O0

int readFromSSDPSocket(SOCKET socket)

{
  int iVar1;
  ssize_t sVar2;
  char local_ae8 [8];
  char ntop_buf [46];
  ssize_t byteReceived;
  http_parser_t *phStack_aa0;
  socklen_t socklen;
  ssdp_thread_data *data;
  ThreadPoolJob job;
  sockaddr_storage __ss;
  char staticBuf [2500];
  unsigned_long *local_18;
  char *requestBuf;
  SOCKET socket_local;
  
  phStack_aa0 = (http_parser_t *)0x0;
  byteReceived._4_4_ = 0x80;
  memset(&data,0,0x30);
  local_18 = &__ss.__ss_align;
  phStack_aa0 = (http_parser_t *)malloc(0x270);
  if (phStack_aa0 != (http_parser_t *)0x0) {
    if ((socket == gSsdpReqSocket4) || (socket == gSsdpReqSocket6)) {
      parser_response_init(phStack_aa0,HTTPMETHOD_MSEARCH);
    }
    else {
      parser_request_init(phStack_aa0);
    }
    iVar1 = membuffer_set_size(&(phStack_aa0->msg).msg,0x9c4);
    if (iVar1 == 0) {
      local_18 = (unsigned_long *)(phStack_aa0->msg).msg.buf;
    }
    else {
      free(phStack_aa0);
      phStack_aa0 = (http_parser_t *)0x0;
    }
  }
  sVar2 = recvfrom(socket,local_18,0x9c3,0,(sockaddr *)&job.priority,
                   (socklen_t *)((long)&byteReceived + 4));
  if (sVar2 < 1) {
    free_ssdp_event_handler_data(phStack_aa0);
    requestBuf._4_4_ = -1;
  }
  else {
    *(char *)((long)local_18 + sVar2) = '\0';
    if ((undefined2)job.priority == HIGH_PRIORITY) {
      inet_ntop(2,&job.jobId,local_ae8,0x2e);
    }
    else if ((undefined2)job.priority == 10) {
      inet_ntop(10,&__ss,local_ae8,0x2e);
    }
    else {
      memset(local_ae8,0,0x2e);
      strncpy(local_ae8,"<Invalid address family>",0x2d);
    }
    UpnpPrintf(UPNP_INFO,SSDP,".upnp/src/ssdp/ssdp_server.c",0x36e,
               "Start of received response ----------------------------------------------------\n%s\nEnd of received response ------------------------------------------------------\nFrom host %s\n"
               ,local_18,local_ae8);
    if (phStack_aa0 != (http_parser_t *)0x0) {
      (phStack_aa0->msg).msg.length = sVar2 + (phStack_aa0->msg).msg.length;
      (phStack_aa0->msg).msg.buf[sVar2] = '\0';
      memcpy(phStack_aa0 + 1,&job.priority,0x80);
      TPJobInit((ThreadPoolJob *)&data,ssdp_event_handler_thread,phStack_aa0);
      TPJobSetFreeFunction((ThreadPoolJob *)&data,free_ssdp_event_handler_data);
      TPJobSetPriority((ThreadPoolJob *)&data,MED_PRIORITY);
      iVar1 = ThreadPoolAdd(&gRecvThreadPool,(ThreadPoolJob *)&data,(int *)0x0);
      if (iVar1 != 0) {
        free_ssdp_event_handler_data(phStack_aa0);
      }
    }
    requestBuf._4_4_ = 0;
  }
  return requestBuf._4_4_;
}

Assistant:

int readFromSSDPSocket(SOCKET socket)
{
	char *requestBuf = NULL;
	char staticBuf[BUFSIZE];
	struct sockaddr_storage __ss;
	ThreadPoolJob job;
	ssdp_thread_data *data = NULL;
	socklen_t socklen = sizeof(__ss);
	ssize_t byteReceived = 0;
	char ntop_buf[INET6_ADDRSTRLEN];

	memset(&job, 0, sizeof(job));

	requestBuf = staticBuf;
	/* in case memory can't be allocated, still drain the socket using a
	 * static buffer. */
	data = malloc(sizeof(ssdp_thread_data));
	if (data) {
		/* initialize parser */
	#ifdef INCLUDE_CLIENT_APIS
		if (socket == gSsdpReqSocket4
		#ifdef UPNP_ENABLE_IPV6
			|| socket == gSsdpReqSocket6
		#endif /* UPNP_ENABLE_IPV6 */
		)
			parser_response_init(&data->parser, HTTPMETHOD_MSEARCH);
		else
			parser_request_init(&data->parser);
	#else  /* INCLUDE_CLIENT_APIS */
		parser_request_init(&data->parser);
	#endif /* INCLUDE_CLIENT_APIS */
		/* set size of parser buffer */
		if (membuffer_set_size(&data->parser.msg.msg, BUFSIZE) == 0)
			/* use this as the buffer for recv */
			requestBuf = data->parser.msg.msg.buf;
		else {
			free(data);
			data = NULL;
		}
	}
	byteReceived = recvfrom(socket,
		requestBuf,
		BUFSIZE - (size_t)1,
		0,
		(struct sockaddr *)&__ss,
		&socklen);
	if (byteReceived > 0) {
		requestBuf[byteReceived] = '\0';
		switch (__ss.ss_family) {
		case AF_INET:
			inet_ntop(AF_INET,
				&((struct sockaddr_in *)&__ss)->sin_addr,
				ntop_buf,
				sizeof(ntop_buf));
			break;
	#ifdef UPNP_ENABLE_IPV6
		case AF_INET6:
			inet_ntop(AF_INET6,
				&((struct sockaddr_in6 *)&__ss)->sin6_addr,
				ntop_buf,
				sizeof(ntop_buf));
			break;
	#endif /* UPNP_ENABLE_IPV6 */
		default:
			memset(ntop_buf, 0, sizeof(ntop_buf));
			strncpy(ntop_buf,
				"<Invalid address family>",
				sizeof(ntop_buf) - 1);
		}
		/* clang-format off */
		UpnpPrintf(UPNP_INFO, SSDP, __FILE__, __LINE__,
			   "Start of received response ----------------------------------------------------\n"
			   "%s\n"
			   "End of received response ------------------------------------------------------\n"
			   "From host %s\n", requestBuf, ntop_buf);
		/* clang-format on */
		/* add thread pool job to handle request */
		if (data != NULL) {
			data->parser.msg.msg.length += (size_t)byteReceived;
			/* null-terminate */
			data->parser.msg.msg.buf[byteReceived] = 0;
			memcpy(&data->dest_addr, &__ss, sizeof(__ss));
			TPJobInit(&job,
				(start_routine)ssdp_event_handler_thread,
				data);
			TPJobSetFreeFunction(
				&job, free_ssdp_event_handler_data);
			TPJobSetPriority(&job, MED_PRIORITY);
			if (ThreadPoolAdd(&gRecvThreadPool, &job, NULL) != 0)
				free_ssdp_event_handler_data(data);
		}
		return 0;
	} else {
		free_ssdp_event_handler_data(data);
		return -1;
	}
}